

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O3

QByteArray * __thiscall
QNetworkCookie::toRawForm(QByteArray *__return_storage_ptr__,QNetworkCookie *this,RawForm form)

{
  QArrayData *pQVar1;
  char cVar2;
  uint uVar3;
  NetworkLayerProtocol NVar4;
  storage_type *psVar5;
  char cVar6;
  QNetworkCookiePrivate *pQVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QStringView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QHostAddress hostAddr;
  QDateTime aQStack_78 [8];
  QLocale local_70 [8];
  QHostAddress local_68 [3];
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar7 = (this->d).d.ptr;
  if ((pQVar7->name).d.size != 0) {
    QByteArray::operator=(__return_storage_ptr__,&pQVar7->name);
    cVar6 = (char)__return_storage_ptr__;
    QByteArray::append(cVar6);
    QByteArray::append(__return_storage_ptr__);
    if (form == Full) {
      pQVar7 = (this->d).d.ptr;
      if (pQVar7->secure == true) {
        QVar9.m_data = (storage_type *)0x8;
        QVar9.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar9);
        pQVar7 = (this->d).d.ptr;
      }
      if (pQVar7->httpOnly == true) {
        QVar10.m_data = (storage_type *)0xa;
        QVar10.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar10);
        pQVar7 = (this->d).d.ptr;
      }
      if (pQVar7->sameSite != Default) {
        QVar11.m_data = (storage_type *)0xb;
        QVar11.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar11);
        uVar3 = ((this->d).d.ptr)->sameSite - None;
        psVar5 = (storage_type *)0x0;
        if (uVar3 < 3) {
          psVar5 = *(storage_type **)(&DAT_0025a7d0 + (ulong)uVar3 * 8);
        }
        QVar12.m_data = psVar5;
        QVar12.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar12);
      }
      cVar2 = QDateTime::isValid();
      if (cVar2 != '\0') {
        QVar13.m_data = (storage_type *)0xa;
        QVar13.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar13);
        QLocale::QLocale(local_70,1,0,0);
        QDateTime::toUTC();
        QVar8.m_data = (storage_type *)0x1e;
        QVar8.m_size = (qsizetype)local_50;
        QString::fromLatin1(QVar8);
        pQVar1 = local_50[0];
        QVar14.m_data = (storage_type_conflict *)aQStack_78;
        QVar14.m_size = (qsizetype)local_70;
        QLocale::toString((QDateTime *)local_68,QVar14);
        QString::toLatin1_helper_inplace((QString *)local_50);
        QByteArray::append(__return_storage_ptr__);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],1,0x10);
          }
        }
        if (local_68[0].d.d.ptr != (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0) {
          LOCK();
          *(int *)local_68[0].d.d.ptr = *(int *)local_68[0].d.d.ptr + -1;
          UNLOCK();
          if (*(int *)local_68[0].d.d.ptr == 0) {
            QArrayData::deallocate((QArrayData *)local_68[0].d.d.ptr,2,0x10);
          }
        }
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
        QDateTime::~QDateTime(aQStack_78);
        QLocale::~QLocale(local_70);
      }
      if ((((this->d).d.ptr)->domain).d.size != 0) {
        QVar15.m_data = (storage_type *)0x9;
        QVar15.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar15);
        cVar2 = QString::startsWith((QChar)((short)(this->d).d.ptr + L'\x10'),0x2e);
        if (cVar2 == '\0') {
          local_68[0].d.d.ptr =
               (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QHostAddress::QHostAddress(local_68,&((this->d).d.ptr)->domain);
          NVar4 = QHostAddress::protocol(local_68);
          if (NVar4 == IPv6Protocol) {
            QByteArray::append(cVar6);
            QString::toUtf8_helper((QString *)local_50);
            QByteArray::append(__return_storage_ptr__);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],1,0x10);
              }
            }
            QByteArray::append(cVar6);
          }
          else {
            QUrl::toAce(local_50,&((this->d).d.ptr)->domain,0);
            QByteArray::append(__return_storage_ptr__);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],1,0x10);
              }
            }
          }
          QHostAddress::~QHostAddress(local_68);
        }
        else {
          QByteArray::append(cVar6);
          QString::mid((longlong)local_68,(longlong)&((this->d).d.ptr)->domain);
          QUrl::toAce(local_50,local_68,0);
          QByteArray::append(__return_storage_ptr__);
          if (local_50[0] != (QArrayData *)0x0) {
            LOCK();
            (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50[0],1,0x10);
            }
          }
          if (local_68[0].d.d.ptr != (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0) {
            LOCK();
            *(int *)local_68[0].d.d.ptr = *(int *)local_68[0].d.d.ptr + -1;
            UNLOCK();
            if (*(int *)local_68[0].d.d.ptr == 0) {
              QArrayData::deallocate((QArrayData *)local_68[0].d.d.ptr,2,0x10);
            }
          }
        }
      }
      if ((((this->d).d.ptr)->path).d.size != 0) {
        QVar16.m_data = (storage_type *)0x7;
        QVar16.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar16);
        QString::toUtf8_helper((QString *)local_50);
        QByteArray::append(__return_storage_ptr__);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],1,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QNetworkCookie::toRawForm(RawForm form) const
{
    QByteArray result;
    if (d->name.isEmpty())
        return result;          // not a valid cookie

    result = d->name;
    result += '=';
    result += d->value;

    if (form == Full) {
        // same as above, but encoding everything back
        if (isSecure())
            result += "; secure";
        if (isHttpOnly())
            result += "; HttpOnly";
        if (d->sameSite != SameSite::Default) {
            result += "; SameSite=";
            result += sameSiteToRawString(d->sameSite);
        }
        if (!isSessionCookie()) {
            result += "; expires=";
            result += QLocale::c().toString(d->expirationDate.toUTC(),
                                            "ddd, dd-MMM-yyyy hh:mm:ss 'GMT"_L1).toLatin1();
        }
        if (!d->domain.isEmpty()) {
            result += "; domain=";
            if (d->domain.startsWith(u'.')) {
                result += '.';
                result += QUrl::toAce(d->domain.mid(1));
            } else {
                QHostAddress hostAddr(d->domain);
                if (hostAddr.protocol() == QAbstractSocket::IPv6Protocol) {
                    result += '[';
                    result += d->domain.toUtf8();
                    result += ']';
                } else {
                    result += QUrl::toAce(d->domain);
                }
            }
        }
        if (!d->path.isEmpty()) {
            result += "; path=";
            result += d->path.toUtf8();
        }
    }
    return result;
}